

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedStruct.hpp
# Opt level: O1

void __thiscall ParsedStruct::ParsedStruct(ParsedStruct *this,ParsedStruct *param_1)

{
  pointer pcVar1;
  
  (this->selectAttr)._M_dataplus._M_p = (pointer)&(this->selectAttr).field_2;
  pcVar1 = (param_1->selectAttr)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + (param_1->selectAttr)._M_string_length);
  (this->havingCond)._M_dataplus._M_p = (pointer)&(this->havingCond).field_2;
  pcVar1 = (param_1->havingCond)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->havingCond,pcVar1,pcVar1 + (param_1->havingCond)._M_string_length);
  (this->groupAttr)._M_dataplus._M_p = (pointer)&(this->groupAttr).field_2;
  pcVar1 = (param_1->groupAttr)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->groupAttr,pcVar1,pcVar1 + (param_1->groupAttr)._M_string_length);
  (this->aggFunc)._M_dataplus._M_p = (pointer)&(this->aggFunc).field_2;
  pcVar1 = (param_1->aggFunc)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->aggFunc,pcVar1,pcVar1 + (param_1->aggFunc)._M_string_length);
  (this->selectCondVect)._M_dataplus._M_p = (pointer)&(this->selectCondVect).field_2;
  pcVar1 = (param_1->selectCondVect)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->selectCondVect,pcVar1,
             pcVar1 + (param_1->selectCondVect)._M_string_length);
  return;
}

Assistant:

ParsedStruct(const ParsedStruct&) = default;